

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

rf_image *
rf_gen_image_gradient_h_to_buffer
          (rf_image *__return_storage_ptr__,int width,int height,rf_color left,rf_color right,
          rf_color *dst,rf_int dst_size)

{
  char cVar1;
  short sVar5;
  short sVar6;
  undefined1 auVar7 [13];
  undefined1 auVar8 [13];
  undefined1 auVar9 [13];
  undefined1 auVar10 [13];
  ulong uVar11;
  undefined1 auVar12 [13];
  undefined1 auVar13 [16];
  long lVar14;
  rf_color *prVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  rf_color *prVar19;
  ulong uVar20;
  bool bVar21;
  short sVar22;
  float fVar23;
  rf_color rVar25;
  undefined1 auVar27 [16];
  float fVar28;
  char cVar2;
  char cVar3;
  char cVar4;
  undefined4 uVar24;
  undefined6 uVar26;
  
  __return_storage_ptr__->format = 0;
  __return_storage_ptr__->valid = false;
  *(undefined3 *)&__return_storage_ptr__->field_0x15 = 0;
  __return_storage_ptr__->data = (void *)0x0;
  auVar13 = _DAT_0016fd00;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  if (width * height * 4 <= dst_size) {
    lVar16 = (long)width;
    auVar7[0xc] = right.a;
    auVar7._0_12_ = ZEXT712(0);
    uVar11 = (ulong)left._0_2_ & 0xffffffffffff00ff;
    auVar8._8_4_ = 0;
    auVar8._0_8_ = uVar11;
    auVar8[0xc] = left.a;
    auVar9[8] = left.b;
    auVar9._0_8_ = uVar11;
    auVar9[9] = 0;
    auVar9._10_3_ = auVar8._10_3_;
    auVar12._5_8_ = 0;
    auVar12._0_5_ = auVar9._8_5_;
    auVar10[4] = left.g;
    auVar10._0_4_ = (int)uVar11;
    auVar10[5] = 0;
    auVar10._6_7_ = SUB137(auVar12 << 0x40,6);
    lVar14 = 0;
    uVar17 = 0;
    if (0 < height) {
      uVar17 = (ulong)(uint)height;
    }
    prVar19 = dst;
    lVar18 = 0;
    if (0 < lVar16) {
      lVar18 = lVar16;
    }
    for (; lVar14 != lVar18; lVar14 = lVar14 + 1) {
      fVar23 = (float)lVar14 / (float)width;
      fVar28 = 1.0 - fVar23;
      auVar27._0_4_ = (int)(fVar23 * (float)((uint)right & 0xff) + fVar28 * (float)(int)uVar11);
      auVar27._4_4_ =
           (int)(fVar23 * (float)((uint)right >> 8 & 0xff) + fVar28 * (float)auVar10._4_4_);
      auVar27._8_4_ =
           (int)(fVar23 * (float)(int)CONCAT32(auVar7._10_3_,(ushort)right.b) +
                fVar28 * (float)auVar9._8_4_);
      auVar27._12_4_ =
           (int)(fVar23 * (float)(uint3)(auVar7._10_3_ >> 0x10) +
                fVar28 * (float)(uint3)(auVar8._10_3_ >> 0x10));
      auVar27 = auVar27 & auVar13;
      sVar5 = auVar27._0_2_;
      cVar1 = (0 < sVar5) * (sVar5 < 0x100) * auVar27[0] - (0xff < sVar5);
      sVar5 = auVar27._2_2_;
      sVar22 = CONCAT11((0 < sVar5) * (sVar5 < 0x100) * auVar27[2] - (0xff < sVar5),cVar1);
      sVar5 = auVar27._4_2_;
      cVar2 = (0 < sVar5) * (sVar5 < 0x100) * auVar27[4] - (0xff < sVar5);
      sVar5 = auVar27._6_2_;
      uVar24 = CONCAT13((0 < sVar5) * (sVar5 < 0x100) * auVar27[6] - (0xff < sVar5),
                        CONCAT12(cVar2,sVar22));
      sVar5 = auVar27._8_2_;
      cVar3 = (0 < sVar5) * (sVar5 < 0x100) * auVar27[8] - (0xff < sVar5);
      sVar5 = auVar27._10_2_;
      uVar26 = CONCAT15((0 < sVar5) * (sVar5 < 0x100) * auVar27[10] - (0xff < sVar5),
                        CONCAT14(cVar3,uVar24));
      sVar5 = auVar27._12_2_;
      cVar4 = (0 < sVar5) * (sVar5 < 0x100) * auVar27[0xc] - (0xff < sVar5);
      sVar6 = auVar27._14_2_;
      sVar5 = (short)((uint)uVar24 >> 0x10);
      rVar25.g = (0 < sVar5) * (sVar5 < 0x100) * cVar2 - (0xff < sVar5);
      rVar25.r = (0 < sVar22) * (sVar22 < 0x100) * cVar1 - (0xff < sVar22);
      sVar5 = (short)((uint6)uVar26 >> 0x20);
      rVar25.b = (0 < sVar5) * (sVar5 < 0x100) * cVar3 - (0xff < sVar5);
      sVar5 = (short)(CONCAT17((0 < sVar6) * (sVar6 < 0x100) * auVar27[0xe] - (0xff < sVar6),
                               CONCAT16(cVar4,uVar26)) >> 0x30);
      rVar25.a = (0 < sVar5) * (sVar5 < 0x100) * cVar4 - (0xff < sVar5);
      prVar15 = prVar19;
      uVar20 = uVar17;
      while (bVar21 = uVar20 != 0, uVar20 = uVar20 - 1, bVar21) {
        *prVar15 = rVar25;
        prVar15 = prVar15 + lVar16;
      }
      prVar19 = prVar19 + 1;
    }
    __return_storage_ptr__->data = dst;
    __return_storage_ptr__->width = width;
    __return_storage_ptr__->height = height;
    __return_storage_ptr__->format = RF_UNCOMPRESSED_R8G8B8A8;
    __return_storage_ptr__->valid = true;
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_gen_image_gradient_h_to_buffer(int width, int height, rf_color left, rf_color right, rf_color* dst, rf_int dst_size)
{
    rf_image result = {0};

    if (dst_size >= width * height * rf_bytes_per_pixel(RF_UNCOMPRESSED_R8G8B8A8))
    {
        for (rf_int i = 0; i < width; i++)
        {
            float factor = ((float)i) / ((float)width);

            for (rf_int j = 0; j < height; j++)
            {
                ((rf_color*)dst)[j * width + i].r = (int)((float)right.r * factor + (float)left.r * (1.f - factor));
                ((rf_color*)dst)[j * width + i].g = (int)((float)right.g * factor + (float)left.g * (1.f - factor));
                ((rf_color*)dst)[j * width + i].b = (int)((float)right.b * factor + (float)left.b * (1.f - factor));
                ((rf_color*)dst)[j * width + i].a = (int)((float)right.a * factor + (float)left.a * (1.f - factor));
            }
        }

        result = (rf_image)
        {
            .data = dst,
            .width = width,
            .height = height,
            .format = RF_UNCOMPRESSED_R8G8B8A8,
            .valid = true
        };
    }

    return result;
}